

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O3

void __thiscall fasttext::FastText::saveVectors(FastText *this)

{
  element_type *peVar1;
  pointer pcVar2;
  char cVar3;
  int32_t iVar4;
  ostream *poVar5;
  long *plVar6;
  invalid_argument *this_00;
  size_type *psVar7;
  int id;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  Vector vec;
  ofstream ofs;
  string local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  peVar1 = (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  pcVar2 = (peVar1->output)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_270,pcVar2,pcVar2 + (peVar1->output)._M_string_length);
  std::__cxx11::string::append((char *)&local_270);
  std::ofstream::ofstream(&local_230,(string *)&local_270,_S_out);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p);
  }
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 != '\0') {
    iVar4 = Dictionary::nwords((this->dict_).
                               super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&local_230,iVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    plVar6 = (long *)std::ostream::operator<<
                               ((ostream *)poVar5,
                                ((this->args_).
                                 super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr)->dim);
    std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
    std::ostream::put((char)plVar6);
    std::ostream::flush();
    Vector::Vector((Vector *)&local_250,
                   (long)((this->args_).
                          super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                         dim);
    id = 0;
    while( true ) {
      iVar4 = Dictionary::nwords((this->dict_).
                                 super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr);
      if (iVar4 <= id) break;
      Dictionary::getWord_abi_cxx11_
                (&local_270,
                 (this->dict_).super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,id);
      getWordVector(this,(Vector *)&local_250,&local_270);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_230,local_270._M_dataplus._M_p,
                          local_270._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      poVar5 = operator<<(poVar5,(Vector *)&local_250);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p);
      }
      id = id + 1;
    }
    std::ofstream::close();
    if (local_250._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_250._M_dataplus._M_p);
    }
    local_230 = _VTT;
    *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _log;
    std::filebuf::~filebuf(local_228);
    std::ios_base::~ios_base(local_138);
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+(&local_250,
                 &((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->output,".vec");
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_250);
  local_270._M_dataplus._M_p = (pointer)*plVar6;
  psVar7 = (size_type *)(plVar6 + 2);
  if ((size_type *)local_270._M_dataplus._M_p == psVar7) {
    local_270.field_2._M_allocated_capacity = *psVar7;
    local_270.field_2._8_8_ = plVar6[3];
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  }
  else {
    local_270.field_2._M_allocated_capacity = *psVar7;
  }
  local_270._M_string_length = plVar6[1];
  *plVar6 = (long)psVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::invalid_argument::invalid_argument(this_00,(string *)&local_270);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void FastText::saveVectors() {
  std::ofstream ofs(args_->output + ".vec");
  if (!ofs.is_open()) {
    throw std::invalid_argument(
        args_->output + ".vec" + " cannot be opened for saving vectors!");
  }
  ofs << dict_->nwords() << " " << args_->dim << std::endl;
  Vector vec(args_->dim);
  for (int32_t i = 0; i < dict_->nwords(); i++) {
    std::string word = dict_->getWord(i);
    getWordVector(vec, word);
    ofs << word << " " << vec << std::endl;
  }
  ofs.close();
}